

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O3

void __thiscall deqp::gls::DrawTest::~DrawTest(DrawTest *this)

{
  ~DrawTest(this);
  operator_delete(this,0x138);
  return;
}

Assistant:

DrawTest::~DrawTest	(void)
{
	deinit();
}